

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rollback_on_exception.hpp
# Opt level: O0

void __thiscall
so_5::details::rollback_on_exception_details::
rollbacker_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sigman78[P]sobjectizer/so_5/rt/impl/layer_core.cpp:127:4)>
::~rollbacker_t(rollbacker_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sigman78[P]sobjectizer_so_5_rt_impl_layer_core_cpp:127:4)>
                *this)

{
  rollbacker_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sigman78[P]sobjectizer_so_5_rt_impl_layer_core_cpp:127:4)>
  *this_local;
  
  if ((this->m_commited & 1U) == 0) {
    so_5::impl::layer_core_t::start::anon_class_16_2_e88080a6::operator()(this->m_action);
  }
  return;
}

Assistant:

inline ~rollbacker_t() { if( !m_commited ) m_action(); }